

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O1

void __thiscall
booster::locale::impl_icu::icu_calendar_facet::~icu_calendar_facet(icu_calendar_facet *this)

{
  pointer pcVar1;
  
  *(undefined ***)&this->super_calendar_facet = &PTR__icu_calendar_facet_001d1ef0;
  pcVar1 = (this->data_).encoding._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->data_).encoding.field_2) {
    operator_delete(pcVar1);
  }
  icu_70::Locale::~Locale(&(this->data_).locale);
  std::locale::facet::~facet((facet *)this);
  operator_delete(this);
  return;
}

Assistant:

icu_calendar_facet(cdata const &d,size_t refs = 0) : 
            calendar_facet(refs),
            data_(d)
        {
        }